

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SIBImporter.cpp
# Opt level: O2

void UnknownChunk(StreamReaderLE *param_1,SIBChunk *chunk)

{
  undefined4 uVar1;
  Logger *this;
  char temp [5];
  char local_1ad;
  undefined1 local_1ac;
  undefined1 local_1ab;
  undefined1 local_1aa;
  undefined1 local_1a9;
  char *local_1a8 [4];
  ostringstream local_188 [376];
  
  uVar1 = *(undefined4 *)
           &(param_1->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  local_1ad = (char)((uint)uVar1 >> 0x18);
  local_1ac = (undefined1)((uint)uVar1 >> 0x10);
  local_1ab = (undefined1)((uint)uVar1 >> 8);
  local_1aa = (undefined1)uVar1;
  local_1a9 = 0;
  this = Assimp::DefaultLogger::get();
  std::__cxx11::ostringstream::ostringstream(local_188);
  std::operator<<((ostream *)local_188,"SIB: Skipping unknown \'");
  std::operator<<((ostream *)local_188,&local_1ad);
  std::operator<<((ostream *)local_188,"\' chunk.");
  std::__cxx11::stringbuf::str();
  Assimp::Logger::warn(this,local_1a8[0]);
  std::__cxx11::string::~string((string *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

static void UnknownChunk(StreamReaderLE* /*stream*/, const SIBChunk& chunk)
{
    char temp[5] = {
        static_cast<char>(( chunk.Tag>>24 ) & 0xff),
        static_cast<char>(( chunk.Tag>>16 ) & 0xff),
        static_cast<char>(( chunk.Tag>>8 ) & 0xff),
        static_cast<char>(chunk.Tag & 0xff), '\0'
    };

    ASSIMP_LOG_WARN((Formatter::format(), "SIB: Skipping unknown '",temp,"' chunk."));
}